

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

uint __thiscall
QXmlStreamReaderPrivate::resolveCharRef(QXmlStreamReaderPrivate *this,int symbolIndex)

{
  Value *pVVar1;
  int iVar2;
  QString *this_00;
  qulonglong qVar3;
  uint uVar4;
  bool *ok;
  uint uVar5;
  long lVar6;
  long lVar7;
  char16_t *pcVar8;
  uint in_R8D;
  long in_FS_OFFSET;
  QStringView string;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 1;
  pVVar1 = this->sym_stack;
  lVar6 = (long)symbolIndex + (long)this->tos;
  lVar7 = (long)pVVar1[lVar6 + -1].prefix;
  if (pVVar1[lVar6 + -1].c == 0x78) {
    this_00 = (QString *)(pVVar1[lVar6 + -1].len - (lVar7 + 1));
    pcVar8 = (this->textBuffer).d.ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = &QString::_empty;
    }
    pcVar8 = pcVar8 + lVar7 + pVVar1[lVar6 + -1].pos + 1;
    ok = (bool *)0x10;
  }
  else {
    this_00 = (QString *)(pVVar1[lVar6 + -1].len - lVar7);
    pcVar8 = (this->textBuffer).d.ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = &QString::_empty;
    }
    pcVar8 = pcVar8 + pVVar1[lVar6 + -1].pos + lVar7;
    ok = (bool *)0xa;
  }
  string.m_data = (storage_type_conflict *)&local_9;
  string.m_size = (qsizetype)pcVar8;
  qVar3 = QString::toIntegral_helper(this_00,string,ok,in_R8D);
  if (qVar3 >> 0x20 == 0) {
    if (((uint)qVar3 < 0xe) && (uVar5 = 1, (0x2600U >> ((uint)qVar3 & 0x1f) & 1) != 0))
    goto LAB_00393283;
  }
  else {
    local_9 = 0;
    qVar3 = 0;
  }
  iVar2 = (int)qVar3;
  uVar5 = 1;
  if (0x1ffd < iVar2 - 0xe000U && 0xd7df < iVar2 - 0x20U) {
    uVar5 = (uint)(iVar2 - 0x10000U < 0x100000);
  }
LAB_00393283:
  uVar4 = local_9 & uVar5;
  if (uVar4 != 0) {
    uVar4 = (uint)qVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

uint QXmlStreamReaderPrivate::resolveCharRef(int symbolIndex)
{
    bool ok = true;
    uint s;
    // ### add toXShort to XmlString?
    if (sym(symbolIndex).c == 'x')
        s = symString(symbolIndex, 1).view().toUInt(&ok, 16);
    else
        s = symString(symbolIndex).view().toUInt(&ok, 10);

    ok &= (s == 0x9 || s == 0xa || s == 0xd || (s >= 0x20 && s <= 0xd7ff)
           || (s >= 0xe000 && s <= 0xfffd) || (s >= 0x10000 && s <= QChar::LastValidCodePoint));

    return ok ? s : 0;
}